

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O1

void __thiscall
vkt::tessellation::anon_unknown_2::IdentityGeometryShaderTestCase::initPrograms
          (IdentityGeometryShaderTestCase *this,SourceCollections *programCollection)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TessPrimitiveType TVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  ProgramSources *pPVar7;
  ostream *poVar8;
  ostringstream src;
  undefined1 auStack_218 [8];
  string local_210;
  string local_1f0;
  undefined1 local_1d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  uint local_1a8;
  undefined4 uStack_1a4;
  value_type local_1a0 [3];
  ios_base local_138 [264];
  
  addVertexAndFragmentShaders(programCollection);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(CONCAT44(uStack_1a4,local_1a8) + -0x18)
                    + 0x70);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"#extension GL_EXT_tessellation_shader : require\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"layout(vertices = 4) out;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "layout(set = 0, binding = 0, std430) readonly restrict buffer TessLevels {\n",0x4b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"    float inner0;\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"    float inner1;\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"    float outer0;\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"    float outer1;\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"    float outer2;\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"    float outer3;\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"} sb_levels;\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"layout(location = 0) in  highp vec4 v_vertex_color[];\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"layout(location = 0) out highp vec4 v_patch_color[];\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n",0x4e)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "    v_patch_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n",0x46);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"    gl_TessLevelInner[0] = sb_levels.inner0;\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"    gl_TessLevelInner[1] = sb_levels.inner1;\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"    gl_TessLevelOuter[0] = sb_levels.outer0;\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"    gl_TessLevelOuter[1] = sb_levels.outer1;\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"    gl_TessLevelOuter[2] = sb_levels.outer2;\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"    gl_TessLevelOuter[3] = sb_levels.outer3;\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"}\n",2);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"tesc","");
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_210);
  std::__cxx11::stringbuf::str();
  local_1d0._0_4_ = 3;
  local_1d0._8_8_ = local_1c0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_1d0 + 8),local_1f0._M_dataplus._M_p,
             local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar7->sources + (local_1d0._0_8_ & 0xffffffff),(value_type *)(local_1d0 + 8));
  if ((char *)local_1d0._8_8_ != local_1c0._M_local_buf + 8) {
    operator_delete((void *)local_1d0._8_8_,local_1c0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"tese_to_frag","");
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,(string *)local_1d0);
  TVar2 = this->m_primitiveType;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"v_fragment_color","");
  generateTessellationEvaluationShader(&local_210,TVar2,&local_1f0);
  local_1a8 = 4;
  paVar1 = &local_1a0[0].field_2;
  local_1a0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,local_210._M_dataplus._M_p,
             local_210._M_dataplus._M_p + local_210._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar7->sources + local_1a8,local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,local_1c0._M_allocated_capacity + 1);
  }
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"tese_to_geom","");
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,(string *)local_1d0);
  TVar2 = this->m_primitiveType;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"v_evaluated_color","");
  generateTessellationEvaluationShader(&local_210,TVar2,&local_1f0);
  local_1a8 = 4;
  local_1a0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,local_210._M_dataplus._M_p,
             local_210._M_dataplus._M_p + local_210._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar7->sources + local_1a8,local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,local_1c0._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(CONCAT44(uStack_1a4,local_1a8) + -0x18)
                    + 0x70);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"#extension GL_EXT_geometry_shader : require\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"layout(",7);
  if (this->m_primitiveType < TESSPRIMITIVETYPE_ISOLINES) {
    pcVar5 = "triangles";
LAB_007cf625:
    bVar3 = false;
  }
  else {
    if (this->m_primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
      pcVar5 = "lines";
      goto LAB_007cf625;
    }
    bVar3 = true;
    pcVar5 = (char *)0x0;
  }
  if (bVar3) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(CONCAT44(uStack_1a4,local_1a8) + -0x18)
                    + 0x70);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"layout(",7);
  if (this->m_primitiveType < TESSPRIMITIVETYPE_ISOLINES) {
    pcVar5 = "triangle_strip";
  }
  else {
    if (this->m_primitiveType != TESSPRIMITIVETYPE_ISOLINES) {
      bVar3 = true;
      pcVar5 = (char *)0x0;
      goto LAB_007cf6b6;
    }
    pcVar5 = "line_strip";
  }
  bVar3 = false;
LAB_007cf6b6:
  if (bVar3) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(CONCAT44(uStack_1a4,local_1a8) + -0x18)
                    + 0x70);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", max_vertices=",0xf);
  iVar4 = numVerticesPerPrimitive(this->m_primitiveType,false);
  poVar8 = (ostream *)std::ostream::operator<<(&local_1a8,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,") out;\n",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"layout(location = 0) in  highp vec4 v_evaluated_color[];\n",0x39);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"layout(location = 0) out highp vec4 v_fragment_color;\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"    for (int ndx = 0; ndx < gl_in.length(); ++ndx)\n",0x33);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    {\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"        gl_Position = gl_in[ndx].gl_Position;\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"        v_fragment_color = v_evaluated_color[ndx];\n",0x33);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        EmitVertex();\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    }\n",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}\n",2);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"geom","");
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_210);
  std::__cxx11::stringbuf::str();
  local_1d0._0_4_ = 2;
  local_1d0._8_8_ = local_1c0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_1d0 + 8),local_1f0._M_dataplus._M_p,
             local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar7->sources + (local_1d0._0_8_ & 0xffffffff),(value_type *)(local_1d0 + 8));
  if ((char *)local_1d0._8_8_ != local_1c0._M_local_buf + 8) {
    operator_delete((void *)local_1d0._8_8_,local_1c0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void IdentityGeometryShaderTestCase::initPrograms (vk::SourceCollections& programCollection) const
{
	addVertexAndFragmentShaders(programCollection);

	// Tessellation control
	{
		std::ostringstream src;
		src <<	glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "layout(vertices = 4) out;\n"
			<< "\n"
			<< "layout(set = 0, binding = 0, std430) readonly restrict buffer TessLevels {\n"
			<< "    float inner0;\n"
			<< "    float inner1;\n"
			<< "    float outer0;\n"
			<< "    float outer1;\n"
			<< "    float outer2;\n"
			<< "    float outer3;\n"
			<< "} sb_levels;\n"
			<< "\n"
			<< "layout(location = 0) in  highp vec4 v_vertex_color[];\n"
			<< "layout(location = 0) out highp vec4 v_patch_color[];\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
			<< "    v_patch_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n"
			<< "\n"
			<< "    gl_TessLevelInner[0] = sb_levels.inner0;\n"
			<< "    gl_TessLevelInner[1] = sb_levels.inner1;\n"
			<< "    gl_TessLevelOuter[0] = sb_levels.outer0;\n"
			<< "    gl_TessLevelOuter[1] = sb_levels.outer1;\n"
			<< "    gl_TessLevelOuter[2] = sb_levels.outer2;\n"
			<< "    gl_TessLevelOuter[3] = sb_levels.outer3;\n"
			<<	"}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	// Tessellation evaluation shader
	{
		programCollection.glslSources.add("tese_to_frag")
			<< glu::TessellationEvaluationSource(generateTessellationEvaluationShader(m_primitiveType, "v_fragment_color"));
		programCollection.glslSources.add("tese_to_geom")
			<< glu::TessellationEvaluationSource(generateTessellationEvaluationShader(m_primitiveType, "v_evaluated_color"));
	}

	// Geometry shader
	{
		std::ostringstream	src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_geometry_shader : require\n"
			<< "layout(" << getGeometryShaderInputPrimitiveTypeShaderName(m_primitiveType, false) << ") in;\n"
			<< "layout(" << getGeometryShaderOutputPrimitiveTypeShaderName(m_primitiveType, false)
						 << ", max_vertices=" << numVerticesPerPrimitive(m_primitiveType, false) << ") out;\n"
			<< "\n"
			<< "layout(location = 0) in  highp vec4 v_evaluated_color[];\n"
			<< "layout(location = 0) out highp vec4 v_fragment_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    for (int ndx = 0; ndx < gl_in.length(); ++ndx)\n"
			<< "    {\n"
			<< "        gl_Position = gl_in[ndx].gl_Position;\n"
			<< "        v_fragment_color = v_evaluated_color[ndx];\n"
			<< "        EmitVertex();\n"
			<< "    }\n"
			<< "}\n";

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}
}